

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::hasLeafData(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
              *this)

{
  bool bVar1;
  long in_RDI;
  undefined1 local_9;
  
  bVar1 = Lib::OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>::isSome
                    ((OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *)(in_RDI + 0x38)
                    );
  local_9 = false;
  if (bVar1) {
    Lib::Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_>::operator->
              ((Option<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *)0x32b297);
    local_9 = Lib::VirtualIterator<Indexing::LiteralClause_*>::hasNext
                        ((VirtualIterator<Indexing::LiteralClause_*> *)0x32b29f);
  }
  return local_9;
}

Assistant:

bool hasNext()
      {
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }

        while(!hasLeafData() && findNextLeaf()) {}
        return hasLeafData();
      }